

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void sigInt(int signo)

{
  long lVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  uVar3 = (ulong)producer_num;
  uVar7 = 0;
  if (uVar3 != 0) {
    lVar4 = 0;
    do {
      uVar6 = (int)uVar7 + *(int *)((long)p + lVar4);
      uVar7 = (ulong)uVar6;
      lVar4 = lVar4 + 4;
    } while (uVar3 * 4 - lVar4 != 0);
    uVar7 = (ulong)(int)uVar6;
  }
  uVar5 = 0;
  if ((ulong)consumer_num != 0) {
    lVar4 = 0;
    do {
      uVar6 = (int)uVar5 + *(int *)((long)c + lVar4);
      uVar5 = (ulong)uVar6;
      lVar4 = lVar4 + 4;
    } while ((ulong)consumer_num << 2 != lVar4);
    uVar5 = (ulong)(int)uVar6;
  }
  dVar8 = (double)(lVar1 - (long)start.__d.__r) / 1000000000.0;
  uVar3 = uVar3 * uVar7 * 0x400;
  lVar1 = sysconf(0x1e);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "----------------------------------------------------------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"producer thread num:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,producer_num);
  poVar2 = std::operator<<(poVar2," consumer thread num: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,consumer_num);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"total_time: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar8);
  poVar2 = std::operator<<(poVar2," seconds\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"total_producer_num: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar7);
  poVar2 = std::operator<<(poVar2," objects\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"toatl_consumer_num: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar5);
  poVar2 = std::operator<<(poVar2," objects\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"page_size:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)lVar1);
  poVar2 = std::operator<<(poVar2," bytes\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"object_size:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x50);
  poVar2 = std::operator<<(poVar2," bytes\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"total_size:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar3);
  poVar2 = std::operator<<(poVar2," bytes\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"ops:");
  lVar1 = uVar5 + uVar7;
  auVar9._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar9._0_8_ = lVar1;
  auVar9._12_4_ = 0x45300000;
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((auVar9._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / dVar8
                     );
  poVar2 = std::operator<<(poVar2," operations/second\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"throught:");
  auVar10._8_4_ = (int)(uVar3 >> 0x20);
  auVar10._0_8_ = uVar3;
  auVar10._12_4_ = 0x45300000;
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(((auVar10._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                             dVar8) * 0.0009765625 * 0.0009765625 * 0.0009765625);
  poVar2 = std::operator<<(poVar2," G/second\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "----------------------------------------------------------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(0);
}

Assistant:

void sigInt(int signo){
    
    auto total_time = std::chrono::duration<double>(std::chrono::steady_clock::now() - start).count(); 
    uint64_t total_producer_objects = std::accumulate(p, p + producer_num, 0);
    uint64_t total_consumer_objects = std::accumulate(c, c + consumer_num, 0);
    uint64_t data_bytes = producer_num * total_producer_objects * sizeof(Object) * DATA_LEN;
   
    uint32_t page_size = sysconf(_SC_PAGESIZE);
    std::cout<<"----------------------------------------------------------------------------------------------------------------------------"<< std::endl; 
    std::cout<<"producer thread num:"<< producer_num <<" consumer thread num: " << consumer_num << std::endl << std::endl;
    std::cout<<"total_time: " << total_time << " seconds\n" << std::endl;
    std::cout<<"total_producer_num: " << total_producer_objects << " objects\n" << std::endl;
    std::cout<<"toatl_consumer_num: " << total_consumer_objects << " objects\n" << std::endl;
    std::cout<<"page_size:" << page_size << " bytes\n" << std::endl;
    std::cout<<"object_size:" << sizeof(Object)  + DATA_LEN << " bytes\n" << std::endl;
    std::cout<<"total_size:" << data_bytes << " bytes\n" << std::endl;
    
    std::cout<<"ops:" << (total_producer_objects + total_consumer_objects) * 1.0 / total_time << " operations/second\n" <<std::endl;
    std::cout<<"throught:" << data_bytes * 1.0 / total_time / 1024 / 1024 / 1024 << " G/second\n" << std::endl; 
    std::cout<<"----------------------------------------------------------------------------------------------------------------------------"<< std::endl; 
    exit(0);
}